

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::LowerConvNum(Lowerer *this,Instr *instrLoad,bool noMathFastPath)

{
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this_01;
  FunctionJITTimeInfo *this_02;
  undefined4 *puVar4;
  LabelInstr *labelTarget;
  LabelInstr *instr;
  
  this_01 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_01);
  this_02 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_02);
  bVar2 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015a4e90,OtherFastPathPhase,sourceContextId,functionId);
  if (!bVar2 && !noMathFastPath) {
    OVar3 = IR::Opnd::GetKind(instrLoad->m_src1);
    if (OVar3 == OpndKindReg) {
      this_00 = instrLoad->m_src1;
      OVar3 = IR::Opnd::GetKind(this_00);
      if (OVar3 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      bVar2 = IR::Opnd::IsTaggedInt(this_00);
      if (bVar2) {
        InsertMove(instrLoad->m_dst,this_00,instrLoad,true);
        IR::Instr::Remove(instrLoad);
        return;
      }
      bVar2 = IR::Opnd::IsNotInt(this_00);
      if (!bVar2) {
        InsertMove(instrLoad->m_dst,this_00,instrLoad,true);
        labelTarget = IR::LabelInstr::New(Label,this->m_func,false);
        bVar2 = LowererMD::GenerateObjectTest
                          (&this->m_lowererMD,this_00,instrLoad,labelTarget,false);
        if (bVar2) {
          instr = IR::LabelInstr::New(Label,this->m_func,true);
          IR::Instr::InsertBefore(instrLoad,&instr->super_Instr);
        }
        if (labelTarget != (LabelInstr *)0x0) {
          IR::Instr::InsertAfter(instrLoad,&labelTarget->super_Instr);
        }
      }
    }
  }
  LowerUnaryHelperMemWithTemp2(this,instrLoad,HelperOp_ConvNumber_Full,HelperOp_ConvNumberInPlace);
  return;
}

Assistant:

void
Lowerer::LowerConvNum(IR::Instr *instrLoad, bool noMathFastPath)
{
    if (PHASE_OFF(Js::OtherFastPathPhase, this->m_func) || noMathFastPath || !instrLoad->GetSrc1()->IsRegOpnd())
    {
        this->LowerUnaryHelperMemWithTemp2(instrLoad, IR_HELPER_OP_FULL_OR_INPLACE(ConvNumber));
        return;
    }

    //      MOV dst, src1
    //      TEST src1, 1
    //      JNE $done
    //      call ToNumber
    //$done:

    bool isInt = false;
    bool isNotInt = false;
    IR::RegOpnd *src1 = instrLoad->GetSrc1()->AsRegOpnd();
    IR::LabelInstr *labelDone = NULL;
    IR::Instr *instr;

    if (src1->IsTaggedInt())
    {
        isInt = true;
    }
    else if (src1->IsNotInt())
    {
        isNotInt = true;
    }
    if (!isNotInt)
    {
        //      MOV dst, src1

        instr = Lowerer::InsertMove(instrLoad->GetDst(), src1, instrLoad);

        if (!isInt)
        {
            labelDone = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
            bool didTest = m_lowererMD.GenerateObjectTest(src1, instrLoad, labelDone);

            if (didTest)
            {
                // This label is needed only to mark the helper block
                IR::LabelInstr * labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
                instrLoad->InsertBefore(labelHelper);
            }
        }
    }

    if (!isInt)
    {
        if (labelDone)
        {
            instrLoad->InsertAfter(labelDone);
        }
        this->LowerUnaryHelperMemWithTemp2(instrLoad, IR_HELPER_OP_FULL_OR_INPLACE(ConvNumber));
    }
    else
    {
        instrLoad->Remove();
    }
}